

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicCounter.h
# Opt level: O2

void __thiscall
aeron::Counter::Counter
          (Counter *this,ClientConductor *clientConductor,AtomicBuffer *buffer,
          int64_t registrationId,int32_t counterId)

{
  (this->super_AtomicCounter)._vptr_AtomicCounter = (_func_int **)&PTR__AtomicCounter_0016fb38;
  (this->super_AtomicCounter).m_buffer._vptr_AtomicBuffer =
       (_func_int **)&PTR__AtomicBuffer_0016f200;
  (this->super_AtomicCounter).m_buffer.m_buffer = buffer->m_buffer;
  (this->super_AtomicCounter).m_buffer.m_length = buffer->m_length;
  (this->super_AtomicCounter).m_counterId = counterId;
  (this->super_AtomicCounter).m_countersManager.
  super___shared_ptr<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_AtomicCounter).m_countersManager.
  super___shared_ptr<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_AtomicCounter).m_offset = counterId << 7;
  (this->super_AtomicCounter)._vptr_AtomicCounter = (_func_int **)&PTR__Counter_0016fae0;
  this->m_clientConductor = clientConductor;
  this->m_registrationId = registrationId;
  (this->m_isClosed)._M_base._M_i = false;
  return;
}

Assistant:

AtomicCounter(const AtomicBuffer& buffer, std::int32_t counterId) :
        m_buffer(buffer),
        m_counterId(counterId),
        m_countersManager(nullptr),
        m_offset(CountersManager::counterOffset(counterId))
    {
    }